

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValueToString
          (Printer *this,Message *message,FieldDescriptor *field,int index,string *output)

{
  Reflection *reflection;
  TextGenerator generator;
  StringOutputStream output_stream;
  TextGenerator local_60;
  StringOutputStream local_38;
  
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  io::StringOutputStream::StringOutputStream(&local_38,output);
  local_60.indent_level_ = this->initial_indent_level_;
  local_60.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&PTR__TextGenerator_006509c0;
  local_60.buffer_ = (char *)0x0;
  local_60.buffer_size_ = 0;
  local_60.at_start_of_line_ = true;
  local_60.failed_ = false;
  local_60.output_ = &local_38.super_ZeroCopyOutputStream;
  local_60.initial_indent_level_ = local_60.indent_level_;
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  PrintFieldValue(this,message,reflection,field,index,&local_60);
  TextGenerator::~TextGenerator(&local_60);
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValueToString(const Message& message,
                                                  const FieldDescriptor* field,
                                                  int index,
                                                  std::string* output) const {
  GOOGLE_DCHECK(output) << "output specified is nullptr";

  output->clear();
  io::StringOutputStream output_stream(output);
  TextGenerator generator(&output_stream, initial_indent_level_);

  PrintFieldValue(message, message.GetReflection(), field, index, &generator);
}